

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O0

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::S2ClosestEdgeQueryBase
          (S2ClosestEdgeQueryBase<S2MinDistance> *this)

{
  ShapeEdgeId local_28;
  allocator<s2shapeutil::ShapeEdgeId> local_1f;
  key_equal local_1e;
  hasher local_1d [13];
  S2ClosestEdgeQueryBase<S2MinDistance> *local_10;
  S2ClosestEdgeQueryBase<S2MinDistance> *this_local;
  
  local_10 = this;
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector(&this->index_covering_);
  absl::InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
  InlinedVector(&this->index_cells_);
  S2MinDistance::S2MinDistance(&this->distance_limit_);
  Result::Result(&this->result_singleton_);
  std::
  vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  ::vector(&this->result_vector_);
  gtl::
  btree_set<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256>
  ::btree_set(&this->result_set_);
  std::allocator<s2shapeutil::ShapeEdgeId>::allocator(&local_1f);
  gtl::
  dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
  ::dense_hash_set(&this->tested_edges_,1,local_1d,&local_1e,&local_1f);
  std::allocator<s2shapeutil::ShapeEdgeId>::~allocator(&local_1f);
  std::
  priority_queue<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,16ul,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>>,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>>
  ::
  priority_queue<absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,16ul,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>>,void>
            ((priority_queue<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,16ul,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>>,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>>
              *)&this->queue_);
  S2ShapeIndex::Iterator::Iterator(&this->iter_);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector(&this->max_distance_covering_);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector(&this->initial_cells_);
  s2shapeutil::ShapeEdgeId::ShapeEdgeId(&local_28,-1,-1);
  gtl::
  dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
  ::set_empty_key(&this->tested_edges_,&local_28);
  return;
}

Assistant:

S2ClosestEdgeQueryBase<Distance>::S2ClosestEdgeQueryBase()
    : tested_edges_(1) /* expected_max_elements*/ {
  tested_edges_.set_empty_key(ShapeEdgeId(-1, -1));
}